

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void FilterCompactCVars(TArray<FBaseCVar_*,_FBaseCVar_*> *cvars,DWORD filter)

{
  uint uVar1;
  FBaseCVar **__base;
  FBaseCVar *local_20;
  FBaseCVar *cvar;
  TArray<FBaseCVar_*,_FBaseCVar_*> *pTStack_10;
  DWORD filter_local;
  TArray<FBaseCVar_*,_FBaseCVar_*> *cvars_local;
  
  cvar._4_4_ = filter;
  pTStack_10 = cvars;
  for (local_20 = CVars; local_20 != (FBaseCVar *)0x0; local_20 = local_20->m_Next) {
    if (((local_20->Flags & cvar._4_4_) != 0) && ((local_20->Flags & 0x4000) == 0)) {
      TArray<FBaseCVar_*,_FBaseCVar_*>::Push(pTStack_10,&local_20);
    }
  }
  uVar1 = TArray<FBaseCVar_*,_FBaseCVar_*>::Size(pTStack_10);
  if (uVar1 != 0) {
    __base = TArray<FBaseCVar_*,_FBaseCVar_*>::operator[](pTStack_10,0);
    uVar1 = TArray<FBaseCVar_*,_FBaseCVar_*>::Size(pTStack_10);
    qsort(__base,(ulong)uVar1,8,sortcvars);
  }
  return;
}

Assistant:

void FilterCompactCVars (TArray<FBaseCVar *> &cvars, DWORD filter)
{
	// Accumulate all cvars that match the filter flags.
	for (FBaseCVar *cvar = CVars; cvar != NULL; cvar = cvar->m_Next)
	{
		if ((cvar->Flags & filter) && !(cvar->Flags & CVAR_IGNORE))
			cvars.Push(cvar);
	}
	// Now sort them, so they're in a deterministic order and not whatever
	// order the linker put them in.
	if (cvars.Size() > 0)
	{
		qsort(&cvars[0], cvars.Size(), sizeof(FBaseCVar *), sortcvars);
	}
}